

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseLine(JSONParser *this,uint32_t *out_line_number)

{
  bool bVar1;
  Result RVar2;
  uint32_t *out_line_number_local;
  JSONParser *this_local;
  
  RVar2 = ExpectKey(this,"line");
  bVar1 = wabt::Failed(RVar2);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = ParseUint32(this,out_line_number);
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseLine(uint32_t* out_line_number) {
  EXPECT_KEY("line");
  CHECK_RESULT(ParseUint32(out_line_number));
  return wabt::Result::Ok;
}